

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O0

void __thiscall
TPZHybridizeHDiv::HybridizeGivenMesh
          (TPZHybridizeHDiv *this,TPZMultiphysicsCompMesh *multiphysics,bool group_elements,
          double Lagrange_term_multiplier)

{
  byte bVar1;
  byte in_DL;
  TPZMultiphysicsCompMesh *in_RSI;
  TPZVec<TPZCompMesh_*> *in_stack_00000058;
  TPZHybridizeHDiv *in_stack_00000060;
  double in_stack_00000080;
  TPZMultiphysicsCompMesh *in_stack_00000088;
  TPZHybridizeHDiv *in_stack_00000090;
  TPZCompMesh *in_stack_00000110;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  TPZMultiphysicsCompMesh::MeshVector(in_RSI);
  ComputePeriferalMaterialIds(in_stack_00000060,in_stack_00000058);
  TPZMultiphysicsCompMesh::MeshVector(in_RSI);
  ComputeNState((TPZHybridizeHDiv *)in_RSI,
                (TPZVec<TPZCompMesh_*> *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  ReCreateMultiphysicsMesh(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  CreateInterfaceElements
            ((TPZHybridizeHDiv *)in_RSI,
             (TPZMultiphysicsCompMesh *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  if ((bVar1 & 1) != 0) {
    GroupandCondenseElements(in_stack_00000110);
  }
  return;
}

Assistant:

void TPZHybridizeHDiv::HybridizeGivenMesh(TPZMultiphysicsCompMesh &multiphysics, bool group_elements, double Lagrange_term_multiplier)
{
    ComputePeriferalMaterialIds(multiphysics.MeshVector());
    ComputeNState(multiphysics.MeshVector());
    ReCreateMultiphysicsMesh(&multiphysics);
    CreateInterfaceElements(&multiphysics);
    if (group_elements) {
        GroupandCondenseElements(&multiphysics);
    }
}